

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

command * __thiscall
libchars::command_set::add
          (command_set *this,string *cmd_str,char *name,id_t ID,filter_t mask_,bool hidden_)

{
  pointer pcVar1;
  token *ptVar2;
  token *ptVar3;
  command *this_00;
  debug *this_01;
  double __x;
  undefined1 local_60 [8];
  string cmd_str_sanitized;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  
  if (name == (char *)0x0 && ID == -1) {
    this_00 = (command *)0x0;
  }
  else {
    ptVar2 = lexer(cmd_str);
    cmd_str_sanitized.field_2._8_8_ = ptVar2;
    if (ptVar2 == (token *)0x0) {
      this_00 = (command *)0x0;
    }
    else {
      this_00 = (command *)0x0;
      ptVar3 = ptVar2;
      do {
        if (((ptVar3->status & 0x400) != 0) || ((ptVar3->value)._M_string_length == 0))
        goto LAB_0010bb3d;
        ptVar3 = ptVar3->next;
      } while (ptVar3 != (token *)0x0);
      local_60 = (undefined1  [8])&cmd_str_sanitized._M_string_length;
      pcVar1 = (ptVar2->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar1,pcVar1 + (ptVar2->value)._M_string_length);
      while (ptVar2 = ptVar2->next, ptVar2 != (token *)0x0) {
        std::__cxx11::string::push_back((char)local_60);
        std::__cxx11::string::_M_append(local_60,(ulong)(ptVar2->value)._M_dataplus._M_p);
      }
      this->dirty = true;
      this_00 = (command *)operator_new(0x98);
      command::command(this_00,(string *)local_60,name,mask_,ID,hidden_);
      this_01 = debug::initialize(0);
      debug::log(this_01,__x);
      if (this->C_list != (command *)0x0) {
        this_00->next = this->C_list;
      }
      this->C_list = this_00;
      if (local_60 != (undefined1  [8])&cmd_str_sanitized._M_string_length) {
        operator_delete((void *)local_60,cmd_str_sanitized._M_string_length + 1);
      }
    }
LAB_0010bb3d:
    std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr
              ((unique_ptr<libchars::token,_std::default_delete<libchars::token>_> *)
               ((long)&cmd_str_sanitized.field_2 + 8));
  }
  return this_00;
}

Assistant:

command* command_set::add(const std::string &cmd_str, const char *name, token::id_t ID, command::filter_t mask_, bool hidden_)
    {
        if (name != NULL || ID != token::ID_NOT_SET) {
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd_str));
            if (Tadd.get() == NULL)
                return NULL;
            // make sure none of the tokens are quoted strings nor empty strings
            token *T = Tadd.get();
            while (T != NULL) {
                if (T->status & token::IS_QUOTED)
                    return NULL;
                if (T->value.empty())
                    return NULL;
                T = T->next;
            }
            // build sanitized version of command string
            T = Tadd.get();
            std::string cmd_str_sanitized(T->value);
            T = T->next;
            while (T != NULL) {
                cmd_str_sanitized += ' ';
                cmd_str_sanitized.append(T->value);
                T = T->next;
            }
            // add command to internal list
            dirty = true;
            command *c_new = new command(cmd_str_sanitized, name, mask_, ID, hidden_);
            LC_LOG_VERBOSE("set[%p] command[%s] = %p",this,cmd_str_sanitized.c_str(),c_new);
            if (C_list != NULL)
                c_new->next = C_list;
            C_list = c_new;
            return c_new;
        }
        return NULL;
    }